

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

int try_disarm(trap *ttmp,boolean force_failure,schar dx,schar dy)

{
  xchar x;
  xchar y;
  monst *pmVar1;
  boolean bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  obj *poVar7;
  long lVar8;
  char *pcVar9;
  trap *trap;
  long lVar10;
  monst *mtmp;
  char *pcVar11;
  char cVar12;
  uint uVar13;
  xchar cy;
  xchar cx;
  xchar by;
  xchar bx;
  boolean local_35;
  int bc;
  
  pmVar1 = level->monsters[ttmp->tx][ttmp->ty];
  mtmp = (monst *)0x0;
  if ((pmVar1 != (monst *)0x0) && ((pmVar1->field_0x61 & 2) == 0)) {
    mtmp = pmVar1;
  }
  uVar13 = (byte)ttmp->field_0x8 & 0x1f;
  cVar12 = (char)uVar13;
  if (mtmp == (monst *)0x0) {
LAB_0026d237:
    poVar7 = sobj_at(0x214,level,(int)ttmp->tx,(int)ttmp->ty);
    if ((poVar7 != (obj *)0x0) &&
       ((((u.uprops[0x3e].intrinsic == 0 && (u.uprops[0x3e].extrinsic == 0)) &&
         (dy != '\0' || dx != '\0')) && (((youmonst.data)->mflags1 & 8) == 0)))) {
      pline("There is a boulder in your way.");
      return 0;
    }
    if (((dy == '\0' || dx == '\0') ||
        (bVar2 = bad_rock(youmonst.data,'\x01',u.ux,ttmp->ty), bVar2 == '\0')) ||
       (bVar2 = bad_rock(youmonst.data,'\x01',ttmp->tx,u.uy), bVar2 == '\0')) {
LAB_0026d338:
      bVar2 = can_reach_floor();
      if (bVar2 != '\0') {
        if ((force_failure == '\0') && (iVar3 = untrap_prob(ttmp), iVar3 == 0)) {
          return 2;
        }
        uVar5 = mt_random();
        uVar5 = uVar5 % 5;
        lVar10 = (long)u.uluck;
        lVar8 = (long)u.moreluck;
        if ((int)(lVar8 + lVar10) != 0) {
          uVar6 = mt_random();
          if (SUB168(ZEXT416(uVar6) % SEXT816(0x32 - (lVar8 + lVar10)),0) != 0) {
            iVar4 = (int)u.moreluck + (int)u.uluck;
            iVar3 = iVar4 / 3;
            if (iVar4 < -5) {
              iVar3 = iVar4;
            }
            uVar6 = uVar5 - iVar3;
            uVar5 = 0;
            if ((-1 < (int)uVar6) && (uVar5 = 4, (int)uVar6 < 4)) {
              uVar5 = uVar6;
            }
          }
        }
        if (uVar5 == 0) {
          pcVar9 = "That";
          if (dy == '\0' && dx == '\0') {
            pcVar9 = "This";
          }
          pcVar11 = "Your";
          if (-1 < (char)ttmp->field_0x8) {
            pcVar11 = pcVar9;
          }
          pcVar9 = "disarm";
          if (cVar12 == '\x13') {
            pcVar9 = "remove";
          }
          pline("%s %s is difficult to %s.",pcVar11,defexplain[(ulong)uVar13 + 0x2f],pcVar9);
          return 1;
        }
        pline("Whoops...");
        if (mtmp == (monst *)0x0) {
          if (dy == '\0' && dx == '\0') {
            dotrap(ttmp,0);
            return 1;
          }
          x = ttmp->tx;
          y = ttmp->ty;
          if ((uball != (obj *)0x0) &&
             (bVar2 = drag_ball(x,y,&bc,&bx,&by,&cx,&cy,&local_35,'\x01'), bVar2 == '\0')) {
            return 1;
          }
          iVar4 = (int)u.ux;
          u.ux0 = u.ux;
          iVar3 = (int)u.uy;
          u.uy0 = u.uy;
          u.umoved = '\x01';
          u.ux = x;
          u.uy = y;
          newsym(iVar4,iVar3);
          vision_recalc(1);
          check_leash(u.ux0,u.uy0);
          if (uball != (obj *)0x0) {
            move_bc(0,bc,bx,by,cx,cy);
          }
          spoteffects('\0');
          exercise(2,'\0');
          return 1;
        }
        if (cVar12 == '\x05') {
          if (mtmp->mtame != '\0') {
            abuse_dog(mtmp);
          }
          uVar13 = mt_random();
          iVar3 = (~uVar13 | 0xfffffffc) + mtmp->mhp;
          mtmp->mhp = iVar3;
          if (iVar3 < 1) {
            killed(mtmp);
            return 1;
          }
          return 1;
        }
        iVar3 = 1;
        if (cVar12 != '\x13') {
          return 1;
        }
        if (youmonst.data != mons + 100 && youmonst.data != mons + 0x62) {
          trap = maketrap(level,(int)u.ux,(int)u.uy,0x13);
          if (trap == (trap *)0x0) {
            return 1;
          }
          pline("The webbing sticks to you. You\'re caught too!");
          dotrap(trap,1);
          if (u.usteed != (monst *)0x0) {
            if (u.utrap != 0) {
              dismount_steed(1);
              return 1;
            }
            return 1;
          }
          return 1;
        }
        pcVar9 = Monnam(mtmp);
        pcVar11 = "%s remains entangled.";
        goto LAB_0026d51d;
      }
      if ((u.usteed != (monst *)0x0) && (u.weapon_skills[0x27].skill < '\x02')) {
        pcVar9 = mon_nam(u.usteed);
        pcVar11 = "You aren\'t skilled enough to reach from %s.";
        goto LAB_0026d43d;
      }
      pcVar9 = defexplain[(ulong)uVar13 + 0x2f];
    }
    else {
      if (invent == (obj *)0x0) {
LAB_0026d31c:
        if ((youmonst.data)->msize < 3) goto LAB_0026d338;
      }
      else {
        iVar3 = inv_weight();
        iVar4 = weight_cap();
        if (iVar4 + iVar3 < 0x259) goto LAB_0026d31c;
      }
      pcVar9 = defexplain[(ulong)uVar13 + 0x2f];
    }
    pcVar11 = "You are unable to reach the %s!";
    iVar3 = 0;
  }
  else {
    if (((mtmp->field_0x62 & 0x80) != 0) && (cVar12 == '\x05' || cVar12 == '\x13'))
    goto LAB_0026d237;
    pcVar9 = Monnam(mtmp);
    pcVar11 = "%s is in the way.";
LAB_0026d43d:
    iVar3 = 0;
  }
LAB_0026d51d:
  pline(pcVar11,pcVar9);
  return iVar3;
}

Assistant:

static int try_disarm(struct trap *ttmp, boolean force_failure, schar dx, schar dy)
{
	struct monst *mtmp = m_at(level, ttmp->tx,ttmp->ty);
	int ttype = ttmp->ttyp;
	boolean under_u = (!dx && !dy);
	boolean holdingtrap = (ttype == BEAR_TRAP || ttype == WEB);
	
	/* Test for monster first, monsters are displayed instead of trap. */
	if (mtmp && (!mtmp->mtrapped || !holdingtrap)) {
		pline("%s is in the way.", Monnam(mtmp));
		return 0;
	}
	/* We might be forced to move onto the trap's location. */
	if (sobj_at(BOULDER, level, ttmp->tx, ttmp->ty)
				&& !Passes_walls && !under_u) {
		pline("There is a boulder in your way.");
		return 0;
	}
	/* duplicate tight-space checks from test_move */
	if (dx && dy &&
	    bad_rock(youmonst.data, TRUE, u.ux, ttmp->ty) &&
	    bad_rock(youmonst.data, TRUE, ttmp->tx, u.uy)) {
	    if ((invent && (inv_weight() + weight_cap() > 600)) ||
		bigmonst(youmonst.data)) {
		/* don't allow untrap if they can't get thru to it */
		pline("You are unable to reach the %s!",
		    trapexplain[ttype-1]);
		return 0;
	    }
	}
	/* untrappable traps are located on the ground. */
	if (!can_reach_floor()) {
		if (u.usteed && P_SKILL(P_RIDING) < P_BASIC)
			pline("You aren't skilled enough to reach from %s.",
				mon_nam(u.usteed));
		else
			pline("You are unable to reach the %s!",
			trapexplain[ttype-1]);
		return 0;
	}

	/* Will our hero succeed? */
	if (force_failure || untrap_prob(ttmp)) {
		if (rnl(5)) {
		    pline("Whoops...");
		    if (mtmp) {		/* must be a trap that holds monsters */
			if (ttype == BEAR_TRAP) {
			    if (mtmp->mtame) abuse_dog(mtmp);
			    if ((mtmp->mhp -= rnd(4)) <= 0) killed(mtmp);
			} else if (ttype == WEB) {
			    if (!webmaker(youmonst.data)) {
				struct trap *ttmp2 = maketrap(level, u.ux, u.uy, WEB);
				if (ttmp2) {
				    pline("The webbing sticks to you. You're caught too!");
				    dotrap(ttmp2, NOWEBMSG);
				    if (u.usteed && u.utrap) {
					/* you, not steed, are trapped */
					dismount_steed(DISMOUNT_FELL);
				    }
				}
			    } else
				pline("%s remains entangled.", Monnam(mtmp));
			}
		    } else if (under_u) {
			dotrap(ttmp, 0);
		    } else {
			move_into_trap(ttmp);
		    }
		} else {
		    pline("%s %s is difficult to %s.",
			  ttmp->madeby_u ? "Your" : under_u ? "This" : "That",
			  trapexplain[ttype-1],
			  (ttype == WEB) ? "remove" : "disarm");
		}
		return 1;
	}
	return 2;
}